

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O0

void __thiscall
higan::MultiplexEpoll::FillActiveChannelList
          (MultiplexEpoll *this,int active_event_num,ChannelList *active_channel_list)

{
  Channel *pCVar1;
  reference pvVar2;
  Channel *local_30;
  Channel *channel;
  ChannelList *pCStack_20;
  int i;
  ChannelList *active_channel_list_local;
  MultiplexEpoll *pMStack_10;
  int active_event_num_local;
  MultiplexEpoll *this_local;
  
  if (active_channel_list != (ChannelList *)0x0) {
    pCStack_20 = active_channel_list;
    active_channel_list_local._4_4_ = active_event_num;
    pMStack_10 = this;
    for (channel._4_4_ = 0; channel._4_4_ < active_channel_list_local._4_4_;
        channel._4_4_ = channel._4_4_ + 1) {
      pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                         (&this->epoll_events_,(long)channel._4_4_);
      pCVar1 = (Channel *)(pvVar2->data).ptr;
      local_30 = pCVar1;
      if (pCVar1 != (Channel *)0x0) {
        pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                           (&this->epoll_events_,(long)channel._4_4_);
        Channel::SetChannelReadable(pCVar1,(pvVar2->events & 1) != 0);
        pCVar1 = local_30;
        pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                           (&this->epoll_events_,(long)channel._4_4_);
        Channel::SetChannelWritable(pCVar1,(pvVar2->events & 4) != 0);
        pCVar1 = local_30;
        pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                           (&this->epoll_events_,(long)channel._4_4_);
        Channel::SetChannelError(pCVar1,(pvVar2->events & 0x18) != 0);
        std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>::push_back
                  (pCStack_20,&local_30);
      }
    }
  }
  return;
}

Assistant:

void MultiplexEpoll::FillActiveChannelList(int active_event_num, MultiplexBase::ChannelList* active_channel_list)
{
	if (active_channel_list == nullptr)
	{
		return;
	}

	for (int i = 0; i < active_event_num; ++i)
	{

		Channel* channel = static_cast<Channel*>(epoll_events_[i].data.ptr);

		if (channel == nullptr)
		{
			continue;
		}

		channel->SetChannelReadable(epoll_events_[i].events & EPOLLIN);
		channel->SetChannelWritable(epoll_events_[i].events & EPOLLOUT);
		channel->SetChannelError(epoll_events_[i].events & (EPOLLERR | EPOLLHUP));

		active_channel_list->push_back(channel);
	}
}